

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O3

void __thiscall UUID_GoodHex_Test::TestBody(UUID_GoodHex_Test *this)

{
  uuid *lhs;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  pointer message_00;
  char *in_R9;
  pointer *__ptr_2;
  string input;
  uuid expected;
  maybe<pstore::uuid,_void> v;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  AssertHelper local_70;
  string local_68;
  uuid local_48;
  maybe<pstore::uuid,_void> local_29;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"0099aaff-AAFF-0990-0099-aaffAAFF0990","");
  local_48.data_._M_elems[0] = '\0';
  local_48.data_._M_elems[1] = 0x99;
  local_48.data_._M_elems[2] = 0xaa;
  local_48.data_._M_elems[3] = 0xff;
  local_48.data_._M_elems[4] = 0xaa;
  local_48.data_._M_elems[5] = 0xff;
  local_48.data_._M_elems[6] = '\t';
  local_48.data_._M_elems[7] = 0x90;
  local_48.data_._M_elems[8] = '\0';
  local_48.data_._M_elems[9] = 0x99;
  local_48.data_._M_elems[10] = 0xaa;
  local_48.data_._M_elems[0xb] = 0xff;
  local_48.data_._M_elems[0xc] = 0xaa;
  local_48.data_._M_elems[0xd] = 0xff;
  local_48.data_._M_elems[0xe] = '\t';
  local_48.data_._M_elems[0xf] = 0x90;
  pstore::uuid::from_string(&local_29,&local_68);
  local_a0[0] = (internal)local_29.valid_;
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((internal)local_29.valid_ == (internal)0x0) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_98;
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,(internal *)local_a0,(AssertionResult *)"v.has_value ()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x5b,(char *)CONCAT71(local_90._1_7_,local_90[0]));
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._1_7_,local_90[0]) != &local_80) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_90._1_7_,local_90[0]),local_80._M_allocated_capacity + 1);
    }
    if (local_a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._M_head_impl + 8))();
    }
    local_88 = local_98;
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001bdf3e;
  }
  else {
    lhs = pstore::maybe<pstore::uuid,_void>::operator->(&local_29);
    testing::internal::CmpHelperEQ<pstore::uuid,pstore::uuid>
              ((internal *)local_90,"*v","expected",lhs,&local_48);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_a0);
      if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
                 ,0x5c,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if ((long *)CONCAT71(local_a0._1_7_,local_a0[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_a0._1_7_,local_a0[0]) + 8))();
      }
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    pstore::uuid::uuid((uuid *)local_a0,&local_68);
    testing::internal::CmpHelperEQ<pstore::uuid,pstore::uuid>
              ((internal *)local_90,"expected","pstore::uuid (input)",&local_48,(uuid *)local_a0);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_a0);
      if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message_00 = "";
      }
      else {
        message_00 = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
                 ,0x5f,message_00);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if ((long *)CONCAT71(local_a0._1_7_,local_a0[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_a0._1_7_,local_a0[0]) + 8))();
      }
    }
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001bdf3e;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_88;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_88);
LAB_001bdf3e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST (UUID, FromNativeType) {
    uuid_t native{0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77,
                  0x88, 0x99, 0xaa, 0xbb, 0xcc, 0xdd, 0xee, 0xff};
    pstore::uuid const expected{"00112233-4455-6677-8899-aabbccddeeff"};
    pstore::uuid actual{native};
    EXPECT_EQ (expected, actual);
}